

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdockarealayout.cpp
# Opt level: O3

int __thiscall QDockAreaLayoutInfo::tabIndexToListIndex(QDockAreaLayoutInfo *this,int tabIndex)

{
  long *plVar1;
  bool bVar2;
  QMetaType QVar3;
  QMetaTypeInterface *pQVar4;
  int iVar5;
  ulong uVar6;
  anon_union_24_3_e3d07ef4_for_data *__return_storage_ptr__;
  undefined8 uVar7;
  long lVar8;
  long in_FS_OFFSET;
  unsigned_long_long t;
  QMetaType local_60;
  QMetaType local_58;
  anon_union_24_3_e3d07ef4_for_data local_50;
  byte local_38;
  undefined7 uStack_37;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  __return_storage_ptr__ = &local_50;
  QTabBar::tabData((QVariant *)__return_storage_ptr__,this->tabBar,tabIndex);
  local_58.d_ptr =
       (QMetaTypeInterface *)&QtPrivate::QMetaTypeInterfaceWrapper<unsigned_long_long>::metaType;
  local_60.d_ptr = (QMetaTypeInterface *)(CONCAT71(uStack_37,local_38) & 0xfffffffffffffffc);
  bVar2 = comparesEqual(&local_60,&local_58);
  if (bVar2) {
    uVar7 = local_50.shared;
    if ((local_38 & 1) != 0) {
      uVar7 = *(QMetaTypeInterface **)(local_50.shared + *(int *)(local_50.shared + 4));
    }
  }
  else {
    local_60.d_ptr = (QMetaTypeInterface *)0x0;
    QVar3.d_ptr = (QMetaTypeInterface *)::QVariant::metaType();
    if ((local_38 & 1) != 0) {
      __return_storage_ptr__ =
           (anon_union_24_3_e3d07ef4_for_data *)(local_50.shared + *(int *)(local_50.shared + 4));
    }
    QMetaType::convert(QVar3,__return_storage_ptr__,local_58,&local_60);
    uVar7 = local_60.d_ptr;
  }
  ::QVariant::~QVariant((QVariant *)&local_50);
  iVar5 = -1;
  if ((this->item_list).d.size != 0) {
    lVar8 = 0;
    uVar6 = 0;
    do {
      plVar1 = *(long **)((long)&((this->item_list).d.ptr)->widgetItem + lVar8);
      if (plVar1 == (long *)0x0) {
        pQVar4 = (QMetaTypeInterface *)0x0;
      }
      else {
        pQVar4 = (QMetaTypeInterface *)(**(code **)(*plVar1 + 0x68))();
      }
      if (pQVar4 == (QMetaTypeInterface *)uVar7) {
        iVar5 = (int)uVar6;
        break;
      }
      uVar6 = uVar6 + 1;
      lVar8 = lVar8 + 0x28;
    } while (uVar6 < (ulong)(this->item_list).d.size);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
    __stack_chk_fail();
  }
  return iVar5;
}

Assistant:

int QDockAreaLayoutInfo::tabIndexToListIndex(int tabIndex) const
{
    Q_ASSERT(tabbed && tabBar);
    quintptr data = qvariant_cast<quintptr>(tabBar->tabData(tabIndex));
    for (int i = 0; i < item_list.size(); ++i) {
        if (tabId(item_list.at(i)) == data)
            return i;
    }
    return -1;
}